

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O1

void __thiscall crnlib::dxt_hc::determine_color_endpoints(dxt_hc *this)

{
  uint *puVar1;
  undefined4 *puVar2;
  long lVar3;
  color_cluster *this_00;
  long lVar4;
  uint *puVar5;
  uint8 uVar6;
  ushort uVar7;
  uint uVar8;
  tile_details *ptVar9;
  color_cluster *pcVar10;
  endpoint_indices_details *peVar11;
  color_quad_u8 (*pacVar12) [16];
  pair<crnlib::vec<6U,_float>,_unsigned_int> *ppVar13;
  undefined8 uVar14;
  dxt_hc *pdVar15;
  pointer __first;
  pointer pNVar16;
  bool bVar17;
  int iVar18;
  executable_task *peVar19;
  int iVar20;
  pair<crnlib::vec<2U,_float>,_unsigned_int> *ppVar21;
  code *pcVar22;
  uint p;
  uint uVar23;
  Node *extraout_RDX;
  Node *extraout_RDX_00;
  ulong uVar24;
  Node *__y;
  ulong uVar25;
  void *pvVar26;
  pair<crnlib::vec<2U,_float>,_unsigned_int> *ppVar27;
  uint uVar28;
  ulong uVar29;
  code *in_R8;
  _Iter_comp_val<std::less<Node>_> *in_R9;
  dxt_hc *pdVar30;
  long lVar31;
  long lVar32;
  task_pool *ptVar33;
  void *pvVar34;
  uint64 uVar35;
  float fVar36;
  Node __value;
  vector<Node>_conflict nodes;
  vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_> endpoints;
  vector<unsigned_int> weights;
  vector<crnlib::vec<6U,_float>_> vectors;
  priority_queue<Node,_std::vector<Node,_std::allocator<Node>_>,_std::less<Node>_> queue;
  color_quad_u8 mirror [16];
  tree_clusterizer<crnlib::vec<6U,_float>_> vq;
  elemental_vector local_1c8;
  elemental_vector local_1b8;
  pair<crnlib::vec<2U,_float>,_unsigned_int> *local_1a0;
  vector<unsigned_int> local_198;
  vector<crnlib::vec<6U,_float>_> local_188;
  dxt_hc *local_170;
  priority_queue<Node,_std::vector<Node,_std::allocator<Node>_>,_std::less<Node>_> local_168;
  long local_140;
  ulong local_138;
  pair<crnlib::vec<6U,_float>,_unsigned_int> *local_130;
  pair<crnlib::vec<6U,_float>,_unsigned_int> *local_128;
  pair<crnlib::vec<2U,_float>,_unsigned_int> *local_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  tree_clusterizer<crnlib::vec<6U,_float>_> local_d8;
  
  uVar8 = this->m_pTask_pool->m_num_threads;
  local_1b8.m_p = (void *)0x0;
  local_1b8.m_size = 0;
  local_1b8.m_capacity = 0;
  local_170 = this;
  if ((this->m_tiles).m_size != 0) {
    lVar31 = 0x14;
    uVar29 = 0;
    do {
      ptVar9 = (local_170->m_tiles).m_p;
      uVar28 = *(uint *)((long)(ptVar9->color_endpoint).m_s + lVar31 + -0x20);
      if (uVar28 != 0) {
        fVar36 = (float)uVar28 * *(float *)((long)(&ptVar9->color_endpoint + -1) + lVar31);
        local_d8.m_weightedVectors._8_8_ =
             *(undefined8 *)((long)(ptVar9->color_endpoint).m_s + lVar31 + -4);
        pcVar22 = (code *)((long)(ptVar9->color_endpoint).m_s + lVar31 + -0x14);
        local_d8.m_vectors = *(vec<6U,_float> **)pcVar22;
        local_d8.m_weightedVectors.m_p = *(vec<6U,_float> **)(pcVar22 + 8);
        if (local_1b8.m_capacity <= local_1b8.m_size) {
          in_R8 = vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_>::object_mover;
          in_R9 = (_Iter_comp_val<std::less<Node>_> *)0x0;
          local_1a0 = (pair<crnlib::vec<2U,_float>,_unsigned_int> *)CONCAT44(local_1a0._4_4_,fVar36)
          ;
          elemental_vector::increase_capacity
                    (&local_1b8,local_1b8.m_size + 1,true,0x1c,
                     vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_>::object_mover,false);
          fVar36 = local_1a0._0_4_;
        }
        lVar3 = (local_1b8._8_8_ & 0xffffffff) * 0x1c;
        *(undefined8 *)((long)local_1b8.m_p + lVar3 + 0x10) = local_d8.m_weightedVectors._8_8_;
        puVar2 = (undefined4 *)((long)local_1b8.m_p + lVar3);
        *puVar2 = local_d8.m_vectors._0_4_;
        puVar2[1] = local_d8.m_vectors._4_4_;
        puVar2[2] = local_d8.m_weightedVectors.m_p._0_4_;
        puVar2[3] = local_d8.m_weightedVectors.m_p._4_4_;
        *(int *)((long)local_1b8.m_p + lVar3 + 0x18) = (int)(long)fVar36;
        local_1b8.m_size = local_1b8.m_size + 1;
      }
      uVar29 = uVar29 + 1;
      lVar31 = lVar31 + 0x48;
    } while (uVar29 < (local_170->m_tiles).m_size);
  }
  local_1c8.m_p = (void *)0x0;
  local_1c8.m_size = 0;
  local_1c8.m_capacity = 0;
  uVar28 = uVar8 + 1;
  if (uVar28 != 0) {
    iVar20 = 1;
    pvVar34 = local_1b8.m_p;
    do {
      pvVar26 = (void *)(((ulong)(local_1b8.m_size * iVar20) / (ulong)uVar28) * 0x1c +
                        (long)local_1b8.m_p);
      if (pvVar34 != pvVar26) {
        if (local_1c8.m_capacity <= local_1c8.m_size) {
          in_R8 = vector<Node>::object_mover;
          in_R9 = (_Iter_comp_val<std::less<Node>_> *)0x0;
          elemental_vector::increase_capacity
                    (&local_1c8,local_1c8.m_size + 1,true,0x10,vector<Node>::object_mover,false);
        }
        lVar31 = (local_1c8._8_8_ & 0xffffffff) * 0x10;
        *(void **)((long)local_1c8.m_p + lVar31) = pvVar34;
        *(void **)((long)local_1c8.m_p + lVar31 + 8) = pvVar26;
        local_1c8.m_size = local_1c8.m_size + 1;
      }
      iVar18 = iVar20 - uVar8;
      iVar20 = iVar20 + 1;
      pvVar34 = pvVar26;
    } while (iVar18 != 1);
  }
  pdVar30 = local_170;
  if (local_1c8.m_size != 0) {
    lVar31 = 0;
    uVar35 = 0;
    do {
      task_pool::queue_task
                (pdVar30->m_pTask_pool,determine_color_endpoints::Node::sort_task,uVar35,
                 (void *)((long)local_1c8.m_p + lVar31));
      uVar35 = uVar35 + 1;
      lVar31 = lVar31 + 0x10;
    } while (uVar35 < (local_1c8._8_8_ & 0xffffffff));
  }
  task_pool::join(pdVar30->m_pTask_pool);
  local_168.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_168.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_168.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (local_1c8.m_size != 0) {
    lVar31 = 0;
    uVar29 = 0;
    do {
      std::priority_queue<Node,_std::vector<Node,_std::allocator<Node>_>,_std::less<Node>_>::push
                (&local_168,(value_type *)((long)local_1c8.m_p + lVar31));
      uVar29 = uVar29 + 1;
      lVar31 = lVar31 + 0x10;
    } while (uVar29 < (local_1c8._8_8_ & 0xffffffff));
  }
  local_188.m_p = (vec<6U,_float> *)0x0;
  local_188.m_size = 0;
  local_188.m_capacity = 0;
  local_198.m_p = (uint *)0x0;
  local_198.m_size = 0;
  local_198.m_capacity = 0;
  vector<crnlib::vec<6U,_float>_>::reserve(&local_188,local_1b8.m_size);
  vector<unsigned_int>::reserve(&local_198,local_1b8.m_size);
  __y = extraout_RDX;
  do {
    while( true ) {
      pNVar16 = local_168.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                super__Vector_impl_data._M_finish;
      __first = local_168.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (local_168.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_168.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_d8.m_node_index_map.m_values.m_p = (raw_node *)0x0;
        local_d8.m_node_index_map.m_values.m_size = 0;
        local_d8.m_node_index_map.m_values.m_capacity = 0;
        local_d8.m_vectorComparison.m_p = (bool *)0x0;
        local_d8.m_vectorComparison.m_size = 0;
        local_d8.m_vectorComparison.m_capacity = 0;
        local_d8.m_vectorsInfoRight.m_p = (VectorInfo *)0x0;
        local_d8.m_vectorsInfoRight.m_size = 0;
        local_d8.m_vectorsInfoRight.m_capacity = 0;
        local_d8.m_vectorsInfoLeft.m_p = (VectorInfo *)0x0;
        local_d8.m_vectorsInfoLeft.m_size = 0;
        local_d8.m_vectorsInfoLeft.m_capacity = 0;
        local_d8.m_vectorsInfo.m_p = (VectorInfo *)0x0;
        local_d8.m_vectorsInfo.m_size = 0;
        local_d8.m_vectorsInfo.m_capacity = 0;
        local_d8.m_weightedDotProducts.m_p = (double *)0x0;
        local_d8.m_weightedDotProducts.m_size = 0;
        local_d8.m_weightedDotProducts.m_capacity = 0;
        local_d8.m_weightedVectors.m_p = (vec<6U,_float> *)0x0;
        local_d8.m_weightedVectors.m_size = 0;
        local_d8.m_weightedVectors.m_capacity = 0;
        local_d8.m_node_index_map.m_hash_shift = 0x20;
        local_d8.m_node_index_map.m_num_valid = 0;
        local_d8.m_node_index_map.m_grow_threshold = 0;
        local_d8.m_nodes.m_p = (vq_node *)0x0;
        local_d8.m_nodes.m_size = 0;
        local_d8.m_nodes.m_capacity = 0;
        local_d8.m_codebook.m_p = (vec<6U,_float> *)0x0;
        local_d8.m_codebook.m_size = 0;
        local_d8.m_codebook.m_capacity = 0;
        uVar28 = (pdVar30->m_params).m_color_endpoint_codebook_size;
        if (pdVar30->m_num_tiles < uVar28) {
          uVar28 = pdVar30->m_num_tiles;
        }
        tree_clusterizer<crnlib::vec<6U,_float>_>::generate_codebook
                  (&local_d8,local_188.m_p,local_198.m_p,local_188.m_size,uVar28,true,
                   pdVar30->m_pTask_pool);
        local_1a0 = (pair<crnlib::vec<2U,_float>,_unsigned_int> *)&pdVar30->m_color_clusters;
        uVar35 = 0;
        vector<crnlib::dxt_hc::color_cluster>::resize
                  ((vector<crnlib::dxt_hc::color_cluster> *)local_1a0,local_d8.m_codebook.m_size,
                   false);
        pdVar15 = local_170;
        ptVar33 = pdVar30->m_pTask_pool;
        do {
          peVar19 = (executable_task *)crnlib_malloc(0x28);
          peVar19->_vptr_executable_task = (_func_int **)&PTR_execute_task_001ce9c0;
          peVar19[1]._vptr_executable_task = (_func_int **)pdVar15;
          peVar19[2]._vptr_executable_task = (_func_int **)determine_color_endpoint_clusters_task;
          peVar19[3]._vptr_executable_task = (_func_int **)0x0;
          *(undefined4 *)&peVar19[4]._vptr_executable_task = 1;
          task_pool::queue_task(ptVar33,peVar19,uVar35,&local_d8);
          uVar28 = (int)uVar35 + 1;
          uVar35 = (uint64)uVar28;
          ptVar33 = pdVar15->m_pTask_pool;
        } while (uVar28 <= ptVar33->m_num_threads);
        task_pool::join(ptVar33);
        pdVar30 = local_170;
        if (local_170->m_num_blocks != 0) {
          lVar31 = 0;
          uVar29 = 0;
          do {
            ptVar9 = (pdVar30->m_tiles).m_p;
            if (*(int *)((long)(ptVar9->color_endpoint).m_s + lVar31 + -0xc) != 0) {
              vector<crnlib::color_quad<unsigned_char,_int>_>::append
                        (&(*(color_cluster **)&local_1a0->first)
                          [*(ushort *)((long)ptVar9->cluster_indices + lVar31)].pixels,
                         (vector<crnlib::color_quad<unsigned_char,_int>_> *)
                         ((long)(ptVar9->color_endpoint).m_s + lVar31 + -0x14));
            }
            uVar29 = uVar29 + 1;
            lVar31 = lVar31 + 0x48;
          } while (uVar29 < pdVar30->m_num_blocks);
        }
        if (pdVar30->m_num_blocks != 0) {
          uVar29 = 0;
          do {
            uVar7 = (pdVar30->m_tiles).m_p[(pdVar30->m_tile_indices).m_p[uVar29]].cluster_indices[0]
            ;
            (pdVar30->m_endpoint_indices).m_p[uVar29].field_0.field_0.color = uVar7;
            pcVar10 = (pdVar30->m_color_clusters).m_p;
            this_00 = pcVar10 + uVar7;
            uVar28 = pcVar10[uVar7].blocks[0].m_size;
            if (pcVar10[uVar7].blocks[0].m_capacity <= uVar28) {
              elemental_vector::increase_capacity
                        ((elemental_vector *)this_00,uVar28 + 1,true,4,(object_mover)0x0,false);
            }
            this_00->blocks[0].m_p[this_00->blocks[0].m_size] = (uint)uVar29;
            puVar1 = &this_00->blocks[0].m_size;
            *puVar1 = *puVar1 + 1;
            if (pdVar30->m_has_subblocks == true) {
              peVar11 = (pdVar30->m_endpoint_indices).m_p;
              uVar6 = peVar11[uVar29].reference;
              if ((uVar6 != '\0') && (uVar7 == peVar11[(uint)uVar29 - 1].field_0.field_0.color)) {
                if (uVar6 != '\x01') {
                  uVar24 = uVar29 >> 1 & 0x7fffffff;
                  uVar28 = 0;
                  pacVar12 = pdVar30->m_blocks;
                  uVar25 = 0;
                  do {
                    uVar23 = (uint)(uVar25 >> 2) & 0x3fffffff | uVar28 & 0xc;
                    *(uchar *)((long)&local_118 + uVar25 * 4) =
                         pacVar12[uVar24][uVar23].field_0.field_0.r;
                    *(uchar *)((long)&local_118 + uVar25 * 4 + 1) =
                         pacVar12[uVar24][uVar23].field_0.field_0.g;
                    *(uchar *)((long)&local_118 + uVar25 * 4 + 2) =
                         pacVar12[uVar24][uVar23].field_0.field_0.b;
                    *(uchar *)((long)&local_118 + uVar25 * 4 + 3) =
                         pacVar12[uVar24][uVar23].field_0.field_0.a;
                    uVar25 = uVar25 + 1;
                    uVar28 = uVar28 + 4;
                  } while (uVar25 != 0x10);
                  pacVar12 = pdVar30->m_blocks;
                  uVar24 = uVar29 >> 1 & 0x7fffffff;
                  *(undefined8 *)(pacVar12[uVar24] + 0xc) = local_e8;
                  *(undefined8 *)(pacVar12[uVar24] + 0xe) = uStack_e0;
                  *(undefined8 *)(pacVar12[uVar24] + 8) = local_f8;
                  *(undefined8 *)(pacVar12[uVar24] + 10) = uStack_f0;
                  *(undefined8 *)(pacVar12[uVar24] + 4) = local_108;
                  *(undefined8 *)(pacVar12[uVar24] + 6) = uStack_100;
                  *(undefined8 *)pacVar12[uVar24] = local_118;
                  *(undefined8 *)(pacVar12[uVar24] + 2) = uStack_110;
                }
                (pdVar30->m_endpoint_indices).m_p[uVar29].reference = '\0';
              }
            }
            uVar29 = uVar29 + 1;
          } while (uVar29 < pdVar30->m_num_blocks);
        }
        ptVar33 = pdVar30->m_pTask_pool;
        uVar35 = 0;
        do {
          bVar17 = pdVar30->m_has_etc_color_blocks;
          peVar19 = (executable_task *)crnlib_malloc(0x28);
          pcVar22 = determine_color_endpoint_codebook_task;
          if (bVar17 != false) {
            pcVar22 = determine_color_endpoint_codebook_task_etc;
          }
          peVar19->_vptr_executable_task = (_func_int **)&PTR_execute_task_001ce9c0;
          peVar19[1]._vptr_executable_task = (_func_int **)pdVar30;
          peVar19[2]._vptr_executable_task = (_func_int **)pcVar22;
          peVar19[3]._vptr_executable_task = (_func_int **)0x0;
          *(undefined4 *)&peVar19[4]._vptr_executable_task = 1;
          task_pool::queue_task(ptVar33,peVar19,uVar35,(void *)0x0);
          uVar28 = (int)uVar35 + 1;
          uVar35 = (uint64)uVar28;
          ptVar33 = pdVar30->m_pTask_pool;
        } while (uVar28 <= ptVar33->m_num_threads);
        task_pool::join(ptVar33);
        tree_clusterizer<crnlib::vec<6U,_float>_>::~tree_clusterizer(&local_d8);
        if (local_198.m_p != (uint *)0x0) {
          crnlib_free(local_198.m_p);
        }
        if (local_188.m_p != (vec<6U,_float> *)0x0) {
          crnlib_free(local_188.m_p);
        }
        if (__first != (pointer)0x0) {
          operator_delete(__first);
        }
        if (local_1c8.m_p != (void *)0x0) {
          crnlib_free(local_1c8.m_p);
        }
        if (local_1b8.m_p != (void *)0x0) {
          crnlib_free(local_1b8.m_p);
        }
        return;
      }
      ppVar27 = (pair<crnlib::vec<2U,_float>,_unsigned_int> *)
                (local_168.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                 super__Vector_impl_data._M_start)->p;
      local_d8.m_weightedVectors.m_p =
           &(local_168.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
             super__Vector_impl_data._M_start)->pEnd->first;
      local_d8.m_vectors = (vec<6U,_float> *)(ppVar27[2].first.m_s + 1);
      ppVar21 = (pair<crnlib::vec<2U,_float>,_unsigned_int> *)local_d8.m_vectors;
      if (0x10 < (long)local_168.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_168.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                       super__Vector_impl_data._M_start) {
        local_128 = local_168.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                    super__Vector_impl_data._M_finish[-1].p;
        local_130 = local_168.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                    super__Vector_impl_data._M_finish[-1].pEnd;
        ppVar13 = (local_168.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                   super__Vector_impl_data._M_start)->pEnd;
        local_168.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
        _M_finish[-1].p =
             (local_168.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
              super__Vector_impl_data._M_start)->p;
        local_168.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
        _M_finish[-1].pEnd = ppVar13;
        local_138 = (long)local_168.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                          super__Vector_impl_data._M_finish +
                    (-0x10 - (long)local_168.c.super__Vector_base<Node,_std::allocator<Node>_>.
                                   _M_impl.super__Vector_impl_data._M_start);
        local_140 = (long)local_138 >> 4;
        local_1a0 = ppVar27;
        local_120 = (pair<crnlib::vec<2U,_float>,_unsigned_int> *)local_d8.m_vectors;
        if (local_140 < 3) {
          lVar31 = 0;
        }
        else {
          lVar3 = local_140 - (local_140 + -1 >> 0x3f);
          lVar32 = 0;
          do {
            lVar4 = lVar32 * 2 + 2;
            lVar31 = lVar32 * 2 + 1;
            bVar17 = std::less<Node>::operator()
                               ((less<Node> *)(__first + lVar4),__first + lVar31,__y);
            if (!bVar17) {
              lVar31 = lVar4;
            }
            ppVar27 = ((Node *)(__first + lVar31))->pEnd;
            ((Node *)(__first + lVar32))->p = ((Node *)(__first + lVar31))->p;
            ((Node *)(__first + lVar32))->pEnd = ppVar27;
            __y = extraout_RDX_00;
            lVar32 = lVar31;
          } while (lVar31 < lVar3 + -1 >> 1);
        }
        ppVar27 = local_1a0;
        if (((local_138 & 0x10) == 0) && (lVar31 == local_140 + -2 >> 1)) {
          lVar3 = lVar31 * 2 + 1;
          ppVar21 = ((Node *)(__first + lVar3))->pEnd;
          ((Node *)(__first + lVar31))->p = ((Node *)(__first + lVar3))->p;
          ((Node *)(__first + lVar31))->pEnd = ppVar21;
          lVar31 = lVar3;
        }
        __value.pEnd = (pair<crnlib::vec<6U,_float>,_unsigned_int> *)in_R8;
        __value.p = local_130;
        std::
        __push_heap<__gnu_cxx::__normal_iterator<crnlib::dxt_hc::determine_color_endpoints()::Node*,std::vector<crnlib::dxt_hc::determine_color_endpoints()::Node,std::allocator<crnlib::dxt_hc::determine_color_endpoints()::Node>>>,long,crnlib::dxt_hc::determine_color_endpoints()::Node,__gnu_cxx::__ops::_Iter_comp_val<std::less<crnlib::dxt_hc::determine_color_endpoints()::Node>>>
                  ((__normal_iterator<Node_*,_std::vector<Node,_std::allocator<Node>_>_>)__first,
                   lVar31,(long)local_128,__value,in_R9);
        ppVar21 = local_120;
        pdVar30 = local_170;
      }
      local_168.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
      _M_finish = pNVar16 + -1;
      if (ppVar21 != (pair<crnlib::vec<2U,_float>,_unsigned_int> *)local_d8.m_weightedVectors.m_p) {
        std::priority_queue<Node,_std::vector<Node,_std::allocator<Node>_>,_std::less<Node>_>::push
                  (&local_168,(value_type *)&local_d8);
      }
      if (local_188.m_size != 0) break;
LAB_00178323:
      if (local_188.m_capacity <= local_188.m_size) {
        in_R8 = (code *)0x0;
        in_R9 = (_Iter_comp_val<std::less<Node>_> *)0x0;
        elemental_vector::increase_capacity
                  ((elemental_vector *)&local_188,local_188.m_size + 1,true,0x18,(object_mover)0x0,
                   false);
      }
      *(undefined8 *)(local_188.m_p[local_188._8_8_ & 0xffffffff].m_s + 4) =
           *(undefined8 *)(ppVar27[1].first.m_s + 1);
      uVar14 = *(undefined8 *)&ppVar27->second;
      *(undefined8 *)local_188.m_p[local_188._8_8_ & 0xffffffff].m_s =
           *(undefined8 *)(ppVar27->first).m_s;
      *(undefined8 *)(local_188.m_p[local_188._8_8_ & 0xffffffff].m_s + 2) = uVar14;
      local_188.m_size = local_188.m_size + 1;
      if (local_198.m_capacity <= local_198.m_size) {
        in_R8 = (code *)0x0;
        in_R9 = (_Iter_comp_val<std::less<Node>_> *)0x0;
        elemental_vector::increase_capacity
                  ((elemental_vector *)&local_198,local_198.m_size + 1,true,4,(object_mover)0x0,
                   false);
      }
      fVar36 = ppVar27[2].first.m_s[0];
      __y = (Node *)(ulong)(uint)fVar36;
      local_198.m_p[local_198._8_8_ & 0xffffffff] = (uint)fVar36;
      local_198.m_size = local_198.m_size + 1;
    }
    fVar36 = (ppVar27->first).m_s[0];
    if ((fVar36 != local_188.m_p[local_188.m_size - 1].m_s[0]) ||
       (NAN(fVar36) || NAN(local_188.m_p[local_188.m_size - 1].m_s[0]))) goto LAB_00178323;
    uVar29 = 0xffffffffffffffff;
    while (uVar29 != 4) {
      puVar5 = (uint *)((long)(&ppVar27->first + 1) + uVar29 * 4);
      uVar24 = uVar29 + 1;
      lVar31 = uVar29 + 2;
      if (((float)*puVar5 != local_188.m_p[local_188.m_size - 1].m_s[lVar31]) ||
         (uVar29 = uVar24,
         NAN((float)*puVar5) || NAN(local_188.m_p[local_188.m_size - 1].m_s[lVar31])))
      goto LAB_00178319;
    }
    uVar24 = 5;
LAB_00178319:
    if (uVar24 < 5) goto LAB_00178323;
    uVar28 = local_198.m_size - 1;
    uVar23 = local_198.m_p[uVar28] + (int)ppVar27[2].first.m_s[0];
    __y = (Node *)(ulong)uVar23;
    if (CARRY4(local_198.m_p[uVar28],(uint)ppVar27[2].first.m_s[0])) {
      local_198.m_p[uVar28] = 0xffffffff;
    }
    else {
      local_198.m_p[uVar28] = uVar23;
    }
  } while( true );
}

Assistant:

void dxt_hc::determine_color_endpoints()
    {
        uint num_tasks = m_pTask_pool->get_num_threads() + 1;
        crnlib::vector<std::pair<vec6F, uint>> endpoints;
        for (uint t = 0; t < m_tiles.size(); t++)
        {
            if (m_tiles[t].pixels.size())
            {
                endpoints.push_back(std::make_pair(m_tiles[t].color_endpoint, (uint)(m_tiles[t].pixels.size() * m_tiles[t].weight)));
            }
        }

        struct Node
        {
            std::pair<vec6F, uint>*p, *pEnd;
            Node(std::pair<vec6F, uint>* begin, std::pair<vec6F, uint>* end) :
                p(begin), pEnd(end)
            {
            }
            bool operator<(const Node& other) const
            {
                return *p > *other.p;
            }
            static void sort_task(uint64 data, void* ptr)
            {
                std::sort(((Node*)ptr)->p, ((Node*)ptr)->pEnd);
            }
        };

        crnlib::vector<Node> nodes;
        Node node(0, endpoints.get_ptr());
        for (uint i = 0; i < num_tasks; i++)
        {
            node.p = node.pEnd;
            node.pEnd = endpoints.get_ptr() + endpoints.size() * (i + 1) / num_tasks;
            if (node.p != node.pEnd)
            {
                nodes.push_back(node);
            }
        }

        for (uint i = 0; i < nodes.size(); i++)
        {
            m_pTask_pool->queue_task(&Node::sort_task, i, &nodes[i]);
        }
        m_pTask_pool->join();

        std::priority_queue<Node> queue;
        for (uint i = 0; i < nodes.size(); i++)
        {
            queue.push(nodes[i]);
        }

        crnlib::vector<vec6F> vectors;
        crnlib::vector<uint> weights;
        vectors.reserve(endpoints.size());
        weights.reserve(endpoints.size());
        while (queue.size())
        {
            Node node = queue.top();
            std::pair<vec6F, uint>* endpoint = node.p++;
            queue.pop();
            if(node.p != node.pEnd)
            {
                queue.push(node);
            }
            if (!vectors.size() || endpoint->first != vectors.back())
            {
                vectors.push_back(endpoint->first);
                weights.push_back(endpoint->second);
            }
            else if (weights.back() > UINT_MAX - endpoint->second)
            {
                weights.back() = UINT_MAX;
            }
            else
            {
                weights.back() += endpoint->second;
            }
        }

        tree_clusterizer<vec6F> vq;
        vq.generate_codebook(vectors.get_ptr(), weights.get_ptr(), vectors.size(), math::minimum<uint>(m_num_tiles, m_params.m_color_endpoint_codebook_size), true, m_pTask_pool);
        m_color_clusters.resize(vq.get_codebook_size());

        for (uint i = 0; i <= m_pTask_pool->get_num_threads(); i++)
        {
            m_pTask_pool->queue_object_task(this, &dxt_hc::determine_color_endpoint_clusters_task, i, &vq);
        }
        m_pTask_pool->join();

        for (uint t = 0; t < m_num_blocks; t++)
        {
            if (m_tiles[t].pixels.size())
            {
                m_color_clusters[m_tiles[t].cluster_indices[cColor]].pixels.append(m_tiles[t].pixels);
            }
        }

        for (uint b = 0; b < m_num_blocks; b++)
        {
            uint cluster_index = m_tiles[m_tile_indices[b]].cluster_indices[cColor];
            m_endpoint_indices[b].component[cColor] = cluster_index;
            m_color_clusters[cluster_index].blocks[cColor].push_back(b);
            if (m_has_subblocks && m_endpoint_indices[b].reference && cluster_index == m_endpoint_indices[b - 1].component[cColor])
            {
                if (m_endpoint_indices[b].reference >> 1)
                {
                    color_quad_u8 mirror[16];
                    for (uint p = 0; p < 16; p++)
                    {
                        mirror[p] = m_blocks[b >> 1][(p << 2 & 12) | p >> 2];
                    }
                    memcpy(m_blocks[b >> 1], mirror, 64);
                }
                m_endpoint_indices[b].reference = 0;
            }
        }

        for (uint i = 0; i <= m_pTask_pool->get_num_threads(); i++)
        {
            m_pTask_pool->queue_object_task(this, m_has_etc_color_blocks ? &dxt_hc::determine_color_endpoint_codebook_task_etc : &dxt_hc::determine_color_endpoint_codebook_task, i, nullptr);
        }
        m_pTask_pool->join();
    }